

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.h
# Opt level: O2

void pybind11::initialize_interpreter(bool init_signal_handlers)

{
  int iVar1;
  accessor<pybind11::detail::accessor_policies::str_attr> local_40;
  char *local_20;
  object local_18;
  
  iVar1 = Py_IsInitialized();
  if (iVar1 == 0) {
    Py_InitializeEx(init_signal_handlers);
    module::import((module *)&local_40.obj,"sys");
    local_40.cache.super_handle.m_ptr = (handle)(handle)local_40.obj.m_ptr;
    local_20 = "path";
    local_18.super_handle.m_ptr = (handle)(PyObject *)0x0;
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<pybind11::list>(&local_40)
    ;
    list::append<char_const(&)[2]>((list *)&local_40,(char (*) [2])0x114782);
    object::~object((object *)&local_40);
    object::~object(&local_18);
    object::~object((object *)&local_40.obj);
    return;
  }
  pybind11_fail("The interpreter is already running");
}

Assistant:

inline void initialize_interpreter(bool init_signal_handlers = true) {
    if (Py_IsInitialized())
        pybind11_fail("The interpreter is already running");

    Py_InitializeEx(init_signal_handlers ? 1 : 0);

    // Make .py files in the working directory available by default
    module::import("sys").attr("path").cast<list>().append(".");
}